

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

example * VW::import_example(vw *all,string *label,primitive_feature_space *features,size_t len)

{
  uint64_t *puVar1;
  parser *ppVar2;
  pointer pcVar3;
  example *peVar4;
  vw *pvVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uchar index;
  byte local_69;
  example *local_68;
  size_t local_60;
  vw *local_58;
  string local_50;
  
  ppVar2 = all->p;
  local_60 = len;
  local_68 = object_pool<example,_example_initializer>::get_object(&ppVar2->example_pool);
  local_68->in_use = true;
  puVar1 = &ppVar2->begin_parsed_examples;
  *puVar1 = *puVar1 + 1;
  (*(all->p->lp).default_label)(&local_68->l);
  if (label->_M_string_length != 0) {
    pcVar3 = (label->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + label->_M_string_length);
    parse_example_label(all,local_68,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  peVar4 = local_68;
  local_58 = all;
  if (local_60 != 0) {
    sVar6 = 0;
    do {
      local_69 = features[sVar6].name;
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)local_68,&local_69);
      if (features[sVar6].len != 0) {
        lVar8 = 8;
        uVar7 = 0;
        do {
          ::features::push_back
                    ((peVar4->super_example_predict).feature_space + local_69,
                     *(feature_value *)((long)features[sVar6].fs + lVar8 + -8),
                     *(feature_index *)((long)&(features[sVar6].fs)->x + lVar8));
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x10;
        } while (uVar7 < features[sVar6].len);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != local_60);
  }
  pvVar5 = local_58;
  peVar4 = local_68;
  setup_example(local_58,local_68);
  puVar1 = &pvVar5->p->end_parsed_examples;
  *puVar1 = *puVar1 + 1;
  return peVar4;
}

Assistant:

example* import_example(vw& all, string label, primitive_feature_space* features, size_t len)
{
  example* ret = &get_unused_example(&all);
  all.p->lp.default_label(&ret->l);

  if (label.length() > 0)
    parse_example_label(all, *ret, label);

  for (size_t i = 0; i < len; i++)
  {
    unsigned char index = features[i].name;
    ret->indices.push_back(index);
    for (size_t j = 0; j < features[i].len; j++)
      ret->feature_space[index].push_back(features[i].fs[j].x, features[i].fs[j].weight_index);
  }

  setup_example(all, ret);
  all.p->end_parsed_examples++;
  return ret;
}